

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptor::CopyTo
          (EnumValueDescriptor *this,EnumValueDescriptorProto *proto)

{
  int32 iVar1;
  EnumValueOptions *pEVar2;
  EnumValueOptions *pEVar3;
  
  EnumValueDescriptorProto::set_name(proto,*(string **)this);
  iVar1 = *(int32 *)(this + 0x10);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 4;
  proto->number_ = iVar1;
  pEVar3 = *(EnumValueOptions **)(this + 0x20);
  pEVar2 = EnumValueOptions::default_instance();
  if (pEVar3 != pEVar2) {
    pEVar3 = EnumValueDescriptorProto::mutable_options(proto);
    EnumValueOptions::CopyFrom(pEVar3,*(EnumValueOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void EnumValueDescriptor::CopyTo(EnumValueDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  if (&options() != &EnumValueOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}